

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

Table * luaH_new(lua_State *L)

{
  Table *t;
  
  t = (Table *)luaC_newobj(L,'\x05',0x30);
  t->metatable = (Table *)0x0;
  t->flags = '?';
  t->array = (Value *)0x0;
  t->asize = 0;
  setnodevector(L,t,0);
  return t;
}

Assistant:

Table *luaH_new (lua_State *L) {
  GCObject *o = luaC_newobj(L, LUA_VTABLE, sizeof(Table));
  Table *t = gco2t(o);
  t->metatable = NULL;
  t->flags = maskflags;  /* table has no metamethod fields */
  t->array = NULL;
  t->asize = 0;
  setnodevector(L, t, 0);
  return t;
}